

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,ServiceDescriptor *descriptor,
          bool immutable)

{
  long lVar1;
  LogMessage *other;
  LogFinisher local_81;
  string local_80;
  LogMessage local_60;
  
  anon_unknown_0::StripPackageName
            (&local_80,*(string **)(descriptor + 8),
             *(FileDescriptor **)(*(long *)(*(long *)(descriptor + 0x10) + 8) + 8));
  lVar1 = std::__cxx11::string::find((char)&local_80,0x2e);
  if (lVar1 != -1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_name_resolver.cc"
               ,0x5a);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: full_name.find(\'.\') == string::npos: ");
    internal::LogFinisher::operator=(&local_81,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  GetClassFullName(__return_storage_ptr__,this,&local_80,*(FileDescriptor **)(descriptor + 0x10),
                   immutable,
                   *(bool *)(*(long *)(*(FileDescriptor **)(descriptor + 0x10) + 0xa0) + 0xa0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassName(const ServiceDescriptor* descriptor,
                                       bool immutable) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          MultipleJavaFiles(descriptor->file(), immutable));
}